

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomwalk.cpp
# Opt level: O2

void __thiscall
RandomWalk::RandomWalk
          (RandomWalk *this,double *sigma,double *dt,uint *nthreads,size_t *n,size_t *nsteps,
          uint32_t *seed)

{
  double *pdVar1;
  uint i;
  uint uVar2;
  Rng local_4038;
  
  this->data = (double *)0x0;
  this->sigma = *sigma;
  this->dt = *dt;
  this->n = *n;
  this->nsteps = *nsteps;
  this->nthreads = (ulong)*nthreads;
  (this->rnd).super__Vector_base<Rng,_std::allocator<Rng>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->rnd).super__Vector_base<Rng,_std::allocator<Rng>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  (this->rnd).super__Vector_base<Rng,_std::allocator<Rng>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  for (uVar2 = 0; uVar2 < *nthreads; uVar2 = uVar2 + 1) {
    Rng::Rng(&local_4038,*seed + uVar2);
    std::vector<Rng,_std::allocator<Rng>_>::emplace_back<Rng>(&this->rnd,&local_4038);
  }
  pdVar1 = (double *)operator_new__(-(ulong)(*nsteps * *n >> 0x3d != 0) | *nsteps * *n * 8);
  this->data = pdVar1;
  return;
}

Assistant:

RandomWalk::RandomWalk(const double & sigma, const double & dt,const unsigned int &nthreads, const size_t & n, const size_t & nsteps, const uint32_t &seed) : sigma{sigma},dt{dt}, data{nullptr}, n{n}, nsteps{nsteps}, nthreads{nthreads}
{
    for (unsigned int i=0;i<nthreads;++i) {
        rnd.push_back(Rng(seed+i));
    }
    data=new double[n*nsteps];
}